

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  char cVar7;
  undefined8 uVar8;
  uint uVar9;
  size_t sVar10;
  int *piVar11;
  U32 UVar12;
  uint uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  uint uVar20;
  U32 UVar21;
  U32 UVar22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  size_t offbaseFound;
  BYTE *litEnd;
  BYTE *litLimit_w;
  size_t local_d0;
  ZSTD_matchState_t *local_c8;
  uint local_bc;
  seqStore_t *local_b8;
  int *local_b0;
  U32 local_a8;
  uint local_a4;
  ulong local_a0;
  int *local_98;
  uint local_8c;
  ulong local_88;
  int *local_80;
  uint local_74;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  int *local_58;
  BYTE *local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar2 = (ms->window).base;
  local_74 = (ms->window).dictLimit;
  uVar27 = (ulong)local_74;
  local_68 = pBVar2 + uVar27;
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_8c = (ms->cParams).searchLog;
  local_bc = 6;
  if (local_8c < 6) {
    local_bc = local_8c;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  pZVar3 = ms->dictMatchState;
  local_60 = (pZVar3->window).base;
  local_38 = local_60 + (pZVar3->window).dictLimit;
  local_70 = (pZVar3->window).nextSrc;
  piVar25 = (int *)((ulong)(((int)src - ((int)local_38 + (int)local_68)) + (int)local_70 == 0) +
                   (long)src);
  UVar22 = *rep;
  UVar12 = rep[1];
  ms->lazySkipping = 0;
  local_80 = (int *)((long)src + (srcSize - 0x10));
  uVar9 = ms->nextToUpdate;
  uVar19 = (ulong)uVar9;
  uVar20 = ((int)local_80 - (int)(pBVar2 + uVar19)) + 1;
  uVar13 = 8;
  if (uVar20 < 8) {
    uVar13 = uVar20;
  }
  if (local_80 < pBVar2 + uVar19) {
    uVar13 = 0;
  }
  if (uVar9 < uVar13 + uVar9) {
    uVar26 = ms->hashSalt;
    cVar7 = (char)ms->rowHashLog;
    do {
      if (local_a4 == 5) {
        uVar23 = *(long *)(pBVar2 + uVar19) * -0x30e4432345000000;
LAB_01d74838:
        UVar21 = (U32)((uVar23 ^ uVar26) >> (0x38U - cVar7 & 0x3f));
      }
      else {
        if (local_a4 == 6) {
          uVar23 = *(long *)(pBVar2 + uVar19) * -0x30e4432340650000;
          goto LAB_01d74838;
        }
        UVar21 = (*(int *)(pBVar2 + uVar19) * -0x61c8864f ^ (uint)uVar26) >> (0x18U - cVar7 & 0x1f);
      }
      ms->hashCache[(uint)uVar19 & 7] = UVar21;
      uVar19 = uVar19 + 1;
    } while (uVar13 + uVar9 != uVar19);
  }
  local_48 = (BYTE *)(srcSize + (long)src);
  local_98 = (int *)src;
  local_40 = rep;
  if (piVar25 < local_80) {
    local_74 = ((int)local_60 - (int)local_70) + local_74;
    local_50 = local_60 + -(ulong)local_74;
    local_58 = (int *)(local_48 + -0x20);
    local_c8 = ms;
    local_b8 = seqStore;
    local_88 = uVar27;
    do {
      pBVar16 = local_48;
      local_b0 = (int *)((long)piVar25 + 1);
      iVar28 = (int)pBVar2;
      uVar9 = (((int)piVar25 - iVar28) - UVar22) + 1;
      uVar13 = (uint)uVar27;
      piVar11 = (int *)(pBVar2 + uVar9);
      if (uVar9 < uVar13) {
        piVar11 = (int *)(local_60 + (uVar9 - local_74));
      }
      local_a8 = UVar12;
      if ((uVar9 - uVar13 < 0xfffffffd) && (*piVar11 == *local_b0)) {
        pBVar15 = local_48;
        if (uVar9 < uVar13) {
          pBVar15 = local_70;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar11 + 1),local_48,pBVar15,
                            local_68);
        uVar27 = sVar10 + 4;
      }
      else {
        uVar27 = 0;
      }
      local_d0 = 999999999;
      if (local_a4 == 6) {
        if (local_bc == 6) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
        else if (local_bc == 5) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
      }
      else if (local_a4 == 5) {
        if (local_bc == 6) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
        else if (local_bc == 5) {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
        }
      }
      else if (local_bc == 6) {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
      }
      else if (local_bc == 5) {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
      }
      else {
        uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (local_c8,(BYTE *)piVar25,pBVar16,&local_d0);
      }
      uVar26 = uVar27;
      if (uVar27 < uVar19) {
        uVar26 = uVar19;
      }
      if (uVar26 < 4) {
        uVar27 = (long)piVar25 - (long)local_98;
        piVar25 = (int *)((long)piVar25 + (uVar27 >> 8) + 1);
        local_c8->lazySkipping = (uint)(0x7ff < uVar27);
        uVar27 = local_88;
        UVar12 = local_a8;
      }
      else {
        piVar11 = piVar25;
        local_a0 = local_d0;
        if (uVar19 <= uVar27) {
          local_a0 = 1;
          piVar11 = local_b0;
        }
        local_b0 = piVar11;
        if (piVar25 < local_80) {
          do {
            piVar11 = (int *)((long)piVar25 + 1);
            uVar9 = ((int)piVar11 - iVar28) - UVar22;
            piVar18 = (int *)(pBVar2 + uVar9);
            if (uVar9 < (uint)local_88) {
              piVar18 = (int *)(local_60 + (uVar9 - local_74));
            }
            if ((uVar9 - (uint)local_88 < 0xfffffffd) && (*piVar18 == *piVar11)) {
              pBVar15 = pBVar16;
              if (uVar9 < (uint)local_88) {
                pBVar15 = local_70;
              }
              sVar10 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar18 + 1),pBVar16,pBVar15,
                                  local_68);
              if (sVar10 < 0xfffffffffffffffc) {
                uVar9 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                  local_a0 = 1;
                  uVar26 = sVar10 + 4;
                  local_b0 = piVar11;
                }
              }
            }
            local_d0 = 999999999;
            if (local_a4 == 6) {
              if (local_bc == 6) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else if (local_bc == 5) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
            }
            else if (local_a4 == 5) {
              if (local_bc == 6) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else if (local_bc == 5) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
            }
            else if (local_bc == 6) {
              uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                 (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
            }
            else if (local_bc == 5) {
              uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                 (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
            }
            else {
              uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                 (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
            }
            bVar6 = true;
            if (3 < uVar27) {
              uVar9 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x1b) < (int)uVar27 * 4 - iVar5) {
                bVar6 = false;
                local_a0 = local_d0;
                uVar26 = uVar27;
                local_b0 = piVar11;
              }
            }
            if (bVar6) {
              if (local_80 <= piVar11) break;
              piVar11 = (int *)((long)piVar25 + 2);
              uVar9 = ((int)piVar11 - iVar28) - UVar22;
              piVar18 = (int *)(pBVar2 + uVar9);
              if (uVar9 < (uint)local_88) {
                piVar18 = (int *)(local_60 + (uVar9 - local_74));
              }
              if ((uVar9 - (uint)local_88 < 0xfffffffd) && (*piVar18 == *piVar11)) {
                pBVar15 = pBVar16;
                if (uVar9 < (uint)local_88) {
                  pBVar15 = local_70;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 6),(BYTE *)(piVar18 + 1),pBVar16,
                                    pBVar15,local_68);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar9 = 0x1f;
                  if ((uint)local_a0 != 0) {
                    for (; (uint)local_a0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                    local_a0 = 1;
                    uVar26 = sVar10 + 4;
                    local_b0 = piVar11;
                  }
                }
              }
              local_d0 = 999999999;
              if (local_a4 == 6) {
                if (local_bc == 6) {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
                else if (local_bc == 5) {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
                else {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
              }
              else if (local_a4 == 5) {
                if (local_bc == 6) {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
                else if (local_bc == 5) {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
                else {
                  uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                     (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
                }
              }
              else if (local_bc == 6) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else if (local_bc == 5) {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                   (local_c8,(BYTE *)piVar11,pBVar16,&local_d0);
              }
              bVar6 = true;
              if (3 < uVar27) {
                uVar9 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                iVar5 = 0x1f;
                if ((uint)local_d0 != 0) {
                  for (; (uint)local_d0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)uVar26 * 4 + -0x18) < (int)uVar27 * 4 - iVar5) {
                  bVar6 = false;
                  local_a0 = local_d0;
                  uVar26 = uVar27;
                  local_b0 = piVar11;
                }
              }
              if (bVar6) break;
            }
            piVar25 = piVar11;
          } while (piVar25 < local_80);
        }
        pZVar3 = local_c8;
        UVar21 = UVar22;
        UVar12 = local_a8;
        if (3 < local_a0) {
          pBVar14 = (BYTE *)((long)local_b0 + (-(long)pBVar2 - local_a0) + -0xfffffffd);
          pBVar15 = pBVar2;
          pBVar16 = local_68;
          if ((uint)pBVar14 < (uint)local_88) {
            pBVar15 = local_50;
            pBVar16 = local_38;
          }
          if ((local_98 < local_b0) &&
             (uVar27 = (ulong)pBVar14 & 0xffffffff, pBVar16 < pBVar15 + uVar27)) {
            pBVar15 = pBVar15 + uVar27;
            do {
              piVar25 = (int *)((long)local_b0 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar25 != *pBVar15) ||
                 (uVar26 = uVar26 + 1, local_b0 = piVar25, piVar25 <= local_98)) break;
            } while (pBVar16 < pBVar15);
          }
          UVar21 = (int)local_a0 - 3;
          UVar12 = UVar22;
        }
        uVar19 = (long)local_b0 - (long)local_98;
        if (local_58 < local_b0) {
          ZSTD_safecopyLiterals(local_b8->lit,(BYTE *)local_98,(BYTE *)local_b0,(BYTE *)local_58);
        }
        else {
          pBVar16 = local_b8->lit;
          uVar8 = *(undefined8 *)(local_98 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_98;
          *(undefined8 *)(pBVar16 + 8) = uVar8;
          if (0x10 < uVar19) {
            pBVar16 = local_b8->lit;
            uVar8 = *(undefined8 *)(local_98 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_98 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar8;
            if (0x20 < (long)uVar19) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x20);
                uVar8 = puVar1[1];
                pBVar15 = pBVar16 + lVar17 + 0x20;
                *(undefined8 *)pBVar15 = *puVar1;
                *(undefined8 *)(pBVar15 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar15 + 0x18) = uVar8;
                lVar17 = lVar17 + 0x20;
              } while (pBVar15 + 0x20 < pBVar16 + uVar19);
            }
          }
        }
        uVar27 = local_88;
        local_b8->lit = local_b8->lit + uVar19;
        if (0xffff < uVar19) {
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4 = local_b8->sequences;
        psVar4->litLength = (U16)uVar19;
        psVar4->offBase = (U32)local_a0;
        if (0xffff < uVar26 - 3) {
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar26 - 3);
        local_b8->sequences = psVar4 + 1;
        if (pZVar3->lazySkipping != 0) {
          uVar9 = pZVar3->nextToUpdate;
          uVar19 = (ulong)uVar9;
          uVar13 = ((int)local_80 - (int)(pBVar2 + uVar19)) + 1;
          if (7 < uVar13) {
            uVar13 = 8;
          }
          if (local_80 < pBVar2 + uVar19) {
            uVar13 = 0;
          }
          if (uVar9 < uVar13 + uVar9) {
            uVar23 = pZVar3->hashSalt;
            cVar7 = (char)pZVar3->rowHashLog;
            do {
              if (local_a4 == 5) {
                uVar24 = *(long *)(pBVar2 + uVar19) * -0x30e4432345000000;
LAB_01d750dc:
                UVar22 = (U32)((uVar24 ^ uVar23) >> (0x38U - cVar7 & 0x3f));
              }
              else {
                if (local_a4 == 6) {
                  uVar24 = *(long *)(pBVar2 + uVar19) * -0x30e4432340650000;
                  goto LAB_01d750dc;
                }
                UVar22 = (*(int *)(pBVar2 + uVar19) * -0x61c8864f ^ (uint)uVar23) >>
                         (0x18U - cVar7 & 0x1f);
              }
              pZVar3->hashCache[(uint)uVar19 & 7] = UVar22;
              uVar19 = uVar19 + 1;
            } while (uVar13 + uVar9 != uVar19);
          }
          pZVar3->lazySkipping = 0;
        }
        piVar25 = (int *)((long)local_b0 + uVar26);
        pBVar16 = local_50;
        local_98 = piVar25;
        do {
          UVar22 = UVar21;
          if (local_80 < piVar25) break;
          uVar9 = ((int)piVar25 - iVar28) - UVar12;
          uVar13 = (uint)uVar27;
          pBVar15 = pBVar2;
          if (uVar9 < uVar13) {
            pBVar15 = pBVar16;
          }
          if ((uVar9 - uVar13 < 0xfffffffd) && (*(int *)(pBVar15 + uVar9) == *piVar25)) {
            pBVar16 = local_48;
            if (uVar9 < uVar13) {
              pBVar16 = local_70;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar25 + 1),(BYTE *)((long)(pBVar15 + uVar9) + 4),local_48
                                ,pBVar16,local_68);
            pBVar16 = local_b8->lit;
            if (local_58 < local_98) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_98,(BYTE *)local_98,(BYTE *)local_58);
            }
            else {
              uVar8 = *(undefined8 *)(local_98 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)local_98;
              *(undefined8 *)(pBVar16 + 8) = uVar8;
            }
            psVar4 = local_b8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < sVar10 + 1) {
              local_b8->longLengthType = ZSTD_llt_matchLength;
              local_b8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar10 + 1);
            local_b8->sequences = psVar4 + 1;
            piVar25 = (int *)((long)piVar25 + sVar10 + 4);
            bVar6 = true;
            pBVar16 = local_50;
            UVar21 = UVar12;
            local_98 = piVar25;
          }
          else {
            bVar6 = false;
            UVar22 = UVar12;
          }
          UVar12 = UVar22;
          UVar22 = UVar21;
        } while (bVar6);
      }
    } while (piVar25 < local_80);
  }
  *local_40 = UVar22;
  local_40[1] = UVar12;
  return (long)local_48 - (long)local_98;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dedicatedDictSearch);
}